

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O2

void __thiscall juzzlin::SimpleLogger::Impl::Impl(Impl *this,string *tag)

{
  this->m_activeLevel = Info;
  (this->m_lock)._M_device = (mutex_type *)m_mutex;
  std::recursive_mutex::lock((recursive_mutex *)m_mutex);
  std::__cxx11::string::string((string *)&this->m_tag,(string *)tag);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_message);
  return;
}

Assistant:

SimpleLogger::Impl::Impl(const std::string & tag)
  : m_lock(m_mutex)
  , m_tag(tag)
{
}